

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O2

int __thiscall QFileSystemModel::rowCount(QFileSystemModel *this,QModelIndex *parent)

{
  QFileSystemModelPrivate *this_00;
  DataPointer *pDVar1;
  bool bVar2;
  QFileSystemNode *pQVar3;
  
  if (0 < parent->c) {
    return 0;
  }
  this_00 = *(QFileSystemModelPrivate **)&this->field_0x8;
  bVar2 = QModelIndex::isValid(parent);
  if (bVar2) {
    pQVar3 = QFileSystemModelPrivate::node(this_00,parent);
    pDVar1 = &(pQVar3->visibleChildren).d;
  }
  else {
    pDVar1 = &(this_00->root).visibleChildren.d;
  }
  return (int)pDVar1->size;
}

Assistant:

int QFileSystemModel::rowCount(const QModelIndex &parent) const
{
    Q_D(const QFileSystemModel);
    if (parent.column() > 0)
        return 0;

    if (!parent.isValid())
        return d->root.visibleChildren.size();

    const QFileSystemModelPrivate::QFileSystemNode *parentNode = d->node(parent);
    return parentNode->visibleChildren.size();
}